

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O3

void Psr_ManReadBlifTest(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  Vec_Ptr_t *vPrs;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  timespec ts;
  timespec local_30;
  
  iVar13 = clock_gettime(3,&local_30);
  if (iVar13 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  vPrs = Psr_ManReadBlif("c/hie/dump/1/netlist_1_out8.blif");
  if (vPrs != (Vec_Ptr_t *)0x0) {
    printf("Finished reading %d networks. ",(ulong)(uint)vPrs->nSize);
    uVar14 = Abc_NamObjNumMax(*(Abc_Nam_t **)((long)*vPrs->pArray + 8));
    printf("NameIDs = %d. ",(ulong)uVar14);
    iVar13 = vPrs->nCap;
    auVar18._8_4_ = iVar13 >> 0x1f;
    auVar18._0_8_ = (long)iVar13;
    auVar18._12_4_ = 0x45300000;
    iVar13 = (int)(((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) * 8.0 + 16.0);
    if (0 < (long)vPrs->nSize) {
      lVar17 = 0;
      do {
        pvVar12 = vPrs->pArray[lVar17];
        iVar15 = *(int *)((long)pvVar12 + 0x10);
        auVar19._8_4_ = iVar15 >> 0x1f;
        auVar19._0_8_ = (long)iVar15;
        auVar19._12_4_ = 0x45300000;
        iVar1 = *(int *)((long)pvVar12 + 0x20);
        auVar20._8_4_ = iVar1 >> 0x1f;
        auVar20._0_8_ = (long)iVar1;
        auVar20._12_4_ = 0x45300000;
        iVar2 = *(int *)((long)pvVar12 + 0x30);
        auVar21._8_4_ = iVar2 >> 0x1f;
        auVar21._0_8_ = (long)iVar2;
        auVar21._12_4_ = 0x45300000;
        iVar3 = *(int *)((long)pvVar12 + 0x40);
        auVar22._8_4_ = iVar3 >> 0x1f;
        auVar22._0_8_ = (long)iVar3;
        auVar22._12_4_ = 0x45300000;
        iVar4 = *(int *)((long)pvVar12 + 0x50);
        auVar23._8_4_ = iVar4 >> 0x1f;
        auVar23._0_8_ = (long)iVar4;
        auVar23._12_4_ = 0x45300000;
        iVar5 = *(int *)((long)pvVar12 + 0x60);
        auVar24._8_4_ = iVar5 >> 0x1f;
        auVar24._0_8_ = (long)iVar5;
        auVar24._12_4_ = 0x45300000;
        iVar6 = *(int *)((long)pvVar12 + 0x70);
        auVar25._8_4_ = iVar6 >> 0x1f;
        auVar25._0_8_ = (long)iVar6;
        auVar25._12_4_ = 0x45300000;
        iVar7 = *(int *)((long)pvVar12 + 0x80);
        auVar26._8_4_ = iVar7 >> 0x1f;
        auVar26._0_8_ = (long)iVar7;
        auVar26._12_4_ = 0x45300000;
        iVar8 = *(int *)((long)pvVar12 + 0x90);
        auVar27._8_4_ = iVar8 >> 0x1f;
        auVar27._0_8_ = (long)iVar8;
        auVar27._12_4_ = 0x45300000;
        iVar9 = *(int *)((long)pvVar12 + 0xa0);
        auVar28._8_4_ = iVar9 >> 0x1f;
        auVar28._0_8_ = (long)iVar9;
        auVar28._12_4_ = 0x45300000;
        iVar10 = *(int *)((long)pvVar12 + 0xc0);
        auVar29._8_4_ = iVar10 >> 0x1f;
        auVar29._0_8_ = (long)iVar10;
        auVar29._12_4_ = 0x45300000;
        iVar11 = *(int *)((long)pvVar12 + 0xb0);
        auVar30._8_4_ = iVar11 >> 0x1f;
        auVar30._0_8_ = (long)iVar11;
        auVar30._12_4_ = 0x45300000;
        iVar13 = iVar13 + (int)((double)(int)((double)(int)((double)(int)((double)(int)((double)(int
                                                  )((double)(int)((double)(int)((double)(int)((
                                                  double)(int)((double)(int)((double)(int)(((auVar19
                                                  ._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar15) -
                                                  4503599627370496.0)) * 4.0 + 16.0 + 224.0) +
                                                  ((auVar20._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar1) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar21._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar2) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar3) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar23._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar4) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar24._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar5) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar25._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar6) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar26._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar7) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar27._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar8) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar28._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar9) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                             ((auVar29._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,iVar10) -
                                             4503599627370496.0)) * 4.0 + 16.0) +
                               ((auVar30._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,iVar11) - 4503599627370496.0)) * 4.0 +
                               16.0);
        lVar17 = lVar17 + 1;
      } while (vPrs->nSize != lVar17);
    }
    iVar15 = Abc_NamMemUsed(*(Abc_Nam_t **)((long)*vPrs->pArray + 8));
    printf("Memory = %.2f MB. ",(double)(iVar15 + iVar13) * 9.5367431640625e-07);
    iVar15 = 3;
    iVar13 = clock_gettime(3,&local_30);
    if (iVar13 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%s =","Time");
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar17 + lVar16) / 1000000.0);
    Psr_ManWriteBlif("c/hie/dump/1/netlist_1_out8_out.blif",vPrs);
    Psr_ManVecFree(vPrs);
  }
  return;
}

Assistant:

void Psr_ManReadBlifTest()
{
    abctime clk = Abc_Clock();
    extern void Psr_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs );
//    Vec_Ptr_t * vPrs = Psr_ManReadBlif( "aga/ray/ray_hie_oper.blif" );
    Vec_Ptr_t * vPrs = Psr_ManReadBlif( "c/hie/dump/1/netlist_1_out8.blif" );
    if ( !vPrs ) return;
    printf( "Finished reading %d networks. ", Vec_PtrSize(vPrs) );
    printf( "NameIDs = %d. ", Abc_NamObjNumMax(Psr_ManNameMan(vPrs)) );
    printf( "Memory = %.2f MB. ", 1.0*Psr_ManMemory(vPrs)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_NamPrint( p->pStrs );
    Psr_ManWriteBlif( "c/hie/dump/1/netlist_1_out8_out.blif", vPrs );
    Psr_ManVecFree( vPrs );
}